

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * create_reference(cJSON *item,internal_hooks *hooks)

{
  cJSON *reference;
  internal_hooks *hooks_local;
  cJSON *item_local;
  
  if (item == (cJSON *)0x0) {
    item_local = (cJSON *)0x0;
  }
  else {
    item_local = cJSON_New_Item(hooks);
    if (item_local == (cJSON *)0x0) {
      item_local = (cJSON *)0x0;
    }
    else {
      memcpy(item_local,item,0x40);
      item_local->string = (char *)0x0;
      item_local->type = item_local->type | 0x100;
      item_local->prev = (cJSON *)0x0;
      item_local->next = (cJSON *)0x0;
    }
  }
  return item_local;
}

Assistant:

static cJSON *create_reference(const cJSON *item, const internal_hooks * const hooks)
{
    cJSON *reference = NULL;
    if (item == NULL)
    {
        return NULL;
    }

    reference = cJSON_New_Item(hooks);
    if (reference == NULL)
    {
        return NULL;
    }

    memcpy(reference, item, sizeof(cJSON));
    reference->string = NULL;
    reference->type |= cJSON_IsReference;
    reference->next = reference->prev = NULL;
    return reference;
}